

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
SugarConvDsk_Conversion_2IPF_Test::~SugarConvDsk_Conversion_2IPF_Test
          (SugarConvDsk_Conversion_2IPF_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SugarConvDsk, Conversion_2IPF)
{
	bool test_ok = true;
	std::vector<std::string> file_list;
	std::stringstream str;
	std::string error_string;

	DiskBuilder disk_builder;
	std::vector<FormatType*> list_formats = disk_builder.GetFormatsList(DiskBuilder::WRITE);

	GetDirectoryContent(dump_dir.string().c_str(), file_list);
	
	const char* ext = "IPF";
	for (auto&it : file_list)
	{
		const std::string filename_to_test = fs::path(it).filename().string();
		const std::string out_filename = filename_to_test + "." + ext;

		const fs::path in_file = fs::path(dump_dir) / filename_to_test;
		const fs::path out_file = fs::path(out_dir) / out_filename;

		std::string options = std::string("-o=") + ext;

 		if (!CompareConversion(in_file.string().c_str(), out_file.string().c_str(), options.c_str(), error_string))
		{
			test_ok = false;
			str << "Error : " << in_file.string() << " -> "<< ext <<" : "<< error_string << "\n";
		}
	}
	ASSERT_TRUE(test_ok) << str.str();
}